

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O0

void Super_WriteLibraryTreeFile_rec
               (FILE *pFile,Super_Man_t *pMan,Super_Gate_t_conflict *pSuper,int *pCounter)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int local_30;
  int i;
  int nFanins;
  int *pCounter_local;
  Super_Gate_t_conflict *pSuper_local;
  Super_Man_t *pMan_local;
  FILE *pFile_local;
  
  if (((*(uint *)&pSuper->field_0x8 & 1) == 0) && (*(uint *)&pSuper->field_0x8 >> 8 == 0)) {
    iVar2 = Mio_GateReadPinNum(pSuper->pRoot);
    for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
      Super_WriteLibraryTreeFile_rec(pFile,pMan,pSuper->pFanins[local_30],pCounter);
    }
    iVar1 = *pCounter;
    *pCounter = iVar1 + 1;
    *(uint *)&pSuper->field_0x8 = *(uint *)&pSuper->field_0x8 & 0xff | iVar1 << 8;
    pcVar3 = "\b";
    if ((*(uint *)&pSuper->field_0x8 >> 1 & 1) != 0) {
      pcVar3 = " * ";
    }
    fprintf((FILE *)pFile,"%s",pcVar3 + 1);
    pcVar3 = Mio_GateReadName(pSuper->pRoot);
    fprintf((FILE *)pFile,"%s",pcVar3);
    for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
      fprintf((FILE *)pFile," %d",(ulong)(*(uint *)&pSuper->pFanins[local_30]->field_0x8 >> 8));
    }
    fprintf((FILE *)pFile,"\n");
  }
  return;
}

Assistant:

void Super_WriteLibraryTreeFile_rec( FILE * pFile, Super_Man_t * pMan, Super_Gate_t * pSuper, int * pCounter )
{
    int nFanins, i;
    // skip an elementary variable and a gate that was already written
    if ( pSuper->fVar || pSuper->Number > 0 )
        return;
    // write the fanins
    nFanins = Mio_GateReadPinNum(pSuper->pRoot);
    for ( i = 0; i < nFanins; i++ )
        Super_WriteLibraryTreeFile_rec( pFile, pMan, pSuper->pFanins[i], pCounter );
    // finally write the gate
    pSuper->Number = (*pCounter)++;
    fprintf( pFile, "%s", pSuper->fSuper? "* " : "" );
    fprintf( pFile, "%s", Mio_GateReadName(pSuper->pRoot) );
    for ( i = 0; i < nFanins; i++ )
        fprintf( pFile, " %d", pSuper->pFanins[i]->Number );
    // write the formula 
    // this step is optional, the resulting library will work in any case
    // however, it may be helpful to for debugging to compare the same library 
    // written in the old format and written in the new format with formulas
//    fprintf( pFile, "    # %s", Super_WriteLibraryGateName( pSuper ) );
    fprintf( pFile, "\n" );
}